

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgssvx.c
# Opt level: O3

void cgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,float *ferr,float *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  char cVar2;
  uint uVar3;
  trans_t tVar4;
  fact_t fVar5;
  yes_no_t yVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  double *pdVar10;
  int_t *piVar11;
  bool bVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float in_XMM0_Da;
  float fVar27;
  float fVar28;
  double dVar29;
  double dVar30;
  float in_XMM1_Da;
  SuperMatrix *local_e0;
  trans_t local_ac;
  float rowcnd;
  float colcnd;
  char norm [1];
  int info1;
  double local_88;
  long local_80;
  long local_78;
  int *local_70;
  int local_68;
  float amax;
  char *local_60;
  long local_58;
  SuperMatrix AC;
  
  piVar8 = (int *)B->Store;
  piVar9 = (int *)X->Store;
  lVar23 = *(long *)(piVar8 + 2);
  local_78 = *(long *)(piVar9 + 2);
  local_80 = (long)*piVar8;
  local_58 = (long)*piVar9;
  uVar3 = B->ncol;
  uVar15 = (ulong)uVar3;
  *info = 0;
  tVar4 = options->Trans;
  bVar24 = tVar4 == NOTRANS;
  fVar5 = options->Fact;
  yVar6 = options->Equil;
  local_70 = perm_r;
  if (fVar5 == FACTORED) {
    cVar2 = *equed;
    bVar25 = true;
    if (cVar2 == 'R') {
LAB_00103216:
      bVar26 = cVar2 == 'B';
    }
    else {
      bVar25 = cVar2 == 'B';
      bVar26 = true;
      if (cVar2 != 'C') goto LAB_00103216;
    }
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
  }
  else {
    *equed = 'N';
    bVar25 = false;
    bVar26 = false;
  }
  iVar14 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar16 = A->nrow;
    iVar14 = -2;
    if (((-1 < (long)iVar16) && (iVar16 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_C && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar26 || bVar25)) {
        if (bVar25) {
          if (iVar16 == 0) {
            iVar14 = -7;
            if (0.0 < in_XMM1_Da) {
LAB_00103365:
              rowcnd = 1.0;
              goto LAB_0010336d;
            }
          }
          else {
            fVar27 = 0.0;
            lVar17 = 0;
            fVar28 = in_XMM1_Da;
            do {
              fVar1 = R[lVar17];
              if (fVar1 <= fVar28) {
                fVar28 = fVar1;
              }
              if (fVar27 <= fVar1) {
                fVar27 = fVar1;
              }
              lVar17 = lVar17 + 1;
            } while (iVar16 != lVar17);
            iVar14 = -7;
            if (0.0 < fVar28) {
              if (iVar16 == 0) goto LAB_00103365;
              if (fVar28 <= in_XMM0_Da) {
                fVar28 = in_XMM0_Da;
              }
              if (in_XMM1_Da <= fVar27) {
                fVar27 = in_XMM1_Da;
              }
              rowcnd = fVar28 / fVar27;
              goto LAB_0010336d;
            }
          }
        }
        else {
LAB_0010336d:
          iVar16 = *info;
          if (!bVar26) goto LAB_001033d6;
          if (iVar16 != 0) goto LAB_001032ac;
          iVar16 = A->nrow;
          if ((long)iVar16 < 1) {
            iVar14 = -8;
            if (0.0 < in_XMM1_Da) {
LAB_0010356a:
              colcnd = 1.0;
              goto LAB_001033de;
            }
          }
          else {
            fVar27 = 0.0;
            lVar17 = 0;
            fVar28 = in_XMM1_Da;
            do {
              fVar1 = C[lVar17];
              if (fVar1 <= fVar28) {
                fVar28 = fVar1;
              }
              if (fVar27 <= fVar1) {
                fVar27 = fVar1;
              }
              lVar17 = lVar17 + 1;
            } while (iVar16 != lVar17);
            iVar14 = -8;
            if (0.0 < fVar28) {
              if (iVar16 < 1) goto LAB_0010356a;
              if (fVar28 <= in_XMM0_Da) {
                fVar28 = in_XMM0_Da;
              }
              if (in_XMM1_Da <= fVar27) {
                fVar27 = in_XMM1_Da;
              }
              colcnd = fVar28 / fVar27;
LAB_001033de:
              iVar16 = -0xc;
              if (lwork < -1) {
LAB_0010342b:
                *info = iVar16;
                bVar12 = false;
              }
              else {
                iVar16 = -0xd;
                if (B->ncol < 0) goto LAB_0010342b;
                bVar12 = true;
                if (B->ncol != 0) {
                  iVar14 = 0;
                  if (0 < A->nrow) {
                    iVar14 = A->nrow;
                  }
                  if ((((*piVar8 < iVar14) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_C)) ||
                     (B->Mtype != SLU_GE)) goto LAB_0010342b;
                }
                iVar16 = 0;
              }
              iVar7 = X->ncol;
              iVar14 = -0xe;
              if (-1 < iVar7) {
                if (iVar7 != 0) {
                  iVar22 = 0;
                  if (0 < A->nrow) {
                    iVar22 = A->nrow;
                  }
                  if (((*piVar9 < iVar22) || (B->ncol != 0 && B->ncol != iVar7)) ||
                     ((X->Stype != SLU_DN || ((X->Dtype != SLU_C || (X->Mtype != SLU_GE))))))
                  goto LAB_001032a6;
                }
                if (!bVar12) goto LAB_001032ac;
                local_60 = equed;
                iVar14 = sp_ienv(1);
                local_88 = (double)CONCAT44(local_88._4_4_,iVar14);
                local_68 = sp_ienv(2);
                pdVar10 = stat->utime;
                if (A->Stype == SLU_NR) {
                  bVar24 = tVar4 != NOTRANS;
                  local_ac = (trans_t)(tVar4 == NOTRANS);
                  piVar11 = (int_t *)A->Store;
                  local_e0 = (SuperMatrix *)superlu_malloc(0x20);
                  cCreate_CompCol_Matrix
                            (local_e0,A->ncol,A->nrow,*piVar11,*(singlecomplex **)(piVar11 + 2),
                             *(int_t **)(piVar11 + 4),*(int_t **)(piVar11 + 6),SLU_NC,A->Dtype,
                             A->Mtype);
                }
                else {
                  local_ac = options->Trans;
                  local_e0 = A;
                }
                if ((fVar5 == FACTORED) || (yVar6 != YES)) {
                  if (fVar5 == FACTORED) goto LAB_0010376c;
                }
                else {
                  dVar29 = SuperLU_timer_();
                  cgsequ(local_e0,R,C,&rowcnd,&colcnd,&amax,&info1);
                  pcVar13 = local_60;
                  if (info1 == 0) {
                    claqgs(local_e0,R,C,rowcnd,colcnd,amax,local_60);
                    cVar2 = *pcVar13;
                    bVar25 = true;
                    if (cVar2 != 'R') {
                      bVar25 = cVar2 == 'B';
                      bVar26 = true;
                      if (cVar2 == 'C') goto LAB_0010364a;
                    }
                    bVar26 = cVar2 == 'B';
                  }
LAB_0010364a:
                  dVar30 = SuperLU_timer_();
                  pdVar10[4] = dVar30 - dVar29;
                }
                dVar29 = SuperLU_timer_();
                if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
                  get_perm_c(options->ColPerm,local_e0,perm_c);
                }
                dVar30 = SuperLU_timer_();
                *pdVar10 = dVar30 - dVar29;
                dVar29 = SuperLU_timer_();
                sp_preorder(options,local_e0,perm_c,etree,&AC);
                dVar30 = SuperLU_timer_();
                pdVar10[3] = dVar30 - dVar29;
                dVar29 = SuperLU_timer_();
                cgstrf(options,&AC,local_68,local_88._0_4_,etree,work,lwork,perm_c,local_70,L,U,Glu,
                       stat,info);
                dVar30 = SuperLU_timer_();
                pdVar10[7] = dVar30 - dVar29;
                if (lwork == -1) {
                  mem_usage->total_needed = (float)(*info - A->ncol);
                  return;
                }
LAB_0010376c:
                iVar14 = *info;
                if (0 < iVar14) {
                  if (A->ncol < iVar14) {
                    return;
                  }
                  fVar27 = cPivotGrowth(iVar14,local_e0,perm_c,L,U);
                  *recip_pivot_growth = fVar27;
                  return;
                }
                if (options->PivotGrowth != NO) {
                  fVar27 = cPivotGrowth(A->ncol,local_e0,perm_c,L,U);
                  *recip_pivot_growth = fVar27;
                }
                if (options->ConditionNumber != NO) {
                  local_88 = SuperLU_timer_();
                  norm[0] = 'I';
                  if (bVar24) {
                    norm[0] = '1';
                  }
                  fVar27 = clangs(norm,local_e0);
                  cgscon(norm,L,U,fVar27,rcond,stat,&info1);
                  dVar29 = SuperLU_timer_();
                  pdVar10[0x10] = dVar29 - local_88;
                }
                if (0 < (int)uVar3) {
                  if (bVar24) {
                    if (bVar25) {
                      uVar3 = A->nrow;
                      lVar17 = lVar23 + 4;
                      uVar19 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          uVar21 = 0;
                          do {
                            *(float *)(lVar17 + -4 + uVar21 * 8) =
                                 *(float *)(lVar17 + -4 + uVar21 * 8) * R[uVar21];
                            *(float *)(lVar17 + uVar21 * 8) =
                                 *(float *)(lVar17 + uVar21 * 8) * R[uVar21];
                            uVar21 = uVar21 + 1;
                          } while (uVar3 != uVar21);
                        }
                        uVar19 = uVar19 + 1;
                        lVar17 = lVar17 + local_80 * 8;
                      } while (uVar19 != uVar15);
                    }
                  }
                  else if (bVar26) {
                    uVar3 = A->nrow;
                    lVar17 = lVar23 + 4;
                    uVar19 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar21 = 0;
                        do {
                          *(float *)(lVar17 + -4 + uVar21 * 8) =
                               *(float *)(lVar17 + -4 + uVar21 * 8) * C[uVar21];
                          *(float *)(lVar17 + uVar21 * 8) =
                               *(float *)(lVar17 + uVar21 * 8) * C[uVar21];
                          uVar21 = uVar21 + 1;
                        } while (uVar3 != uVar21);
                      }
                      uVar19 = uVar19 + 1;
                      lVar17 = lVar17 + local_80 * 8;
                    } while (uVar19 != uVar15);
                  }
                  uVar21 = (ulong)(uint)B->nrow;
                  lVar18 = local_58 * 8;
                  uVar19 = 0;
                  lVar17 = local_78;
                  do {
                    if (0 < (int)uVar21) {
                      lVar20 = 0;
                      do {
                        *(undefined8 *)(lVar17 + lVar20 * 8) = *(undefined8 *)(lVar23 + lVar20 * 8);
                        lVar20 = lVar20 + 1;
                        uVar21 = (ulong)B->nrow;
                      } while (lVar20 < (long)uVar21);
                    }
                    uVar19 = uVar19 + 1;
                    lVar23 = lVar23 + local_80 * 8;
                    lVar17 = lVar17 + lVar18;
                  } while (uVar19 != uVar15);
                  dVar29 = SuperLU_timer_();
                  cgstrs(local_ac,L,U,perm_c,local_70,X,stat,&info1);
                  dVar30 = SuperLU_timer_();
                  pdVar10[0x11] = dVar30 - dVar29;
                  dVar29 = SuperLU_timer_();
                  if (options->IterRefine == NOREFINE) {
                    uVar19 = 0;
                    do {
                      berr[uVar19] = 1.0;
                      ferr[uVar19] = 1.0;
                      uVar19 = uVar19 + 1;
                    } while (uVar15 != uVar19);
                  }
                  else {
                    cgsrfs(local_ac,local_e0,L,U,perm_c,local_70,local_60,R,C,B,X,ferr,berr,stat,
                           &info1);
                  }
                  dVar30 = SuperLU_timer_();
                  pdVar10[0x12] = dVar30 - dVar29;
                  if (bVar24) {
                    if (bVar26) {
                      uVar3 = A->nrow;
                      lVar23 = local_78 + 4;
                      uVar19 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          uVar21 = 0;
                          do {
                            *(float *)(lVar23 + -4 + uVar21 * 8) =
                                 *(float *)(lVar23 + -4 + uVar21 * 8) * C[uVar21];
                            *(float *)(lVar23 + uVar21 * 8) =
                                 *(float *)(lVar23 + uVar21 * 8) * C[uVar21];
                            uVar21 = uVar21 + 1;
                          } while (uVar3 != uVar21);
                        }
                        uVar19 = uVar19 + 1;
                        lVar23 = lVar23 + lVar18;
                      } while (uVar19 != uVar15);
                    }
                  }
                  else if (bVar25) {
                    uVar3 = A->nrow;
                    lVar23 = local_78 + 4;
                    uVar19 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar21 = 0;
                        do {
                          *(float *)(lVar23 + -4 + uVar21 * 8) =
                               *(float *)(lVar23 + -4 + uVar21 * 8) * R[uVar21];
                          *(float *)(lVar23 + uVar21 * 8) =
                               *(float *)(lVar23 + uVar21 * 8) * R[uVar21];
                          uVar21 = uVar21 + 1;
                        } while (uVar3 != uVar21);
                      }
                      uVar19 = uVar19 + 1;
                      lVar23 = lVar23 + lVar18;
                    } while (uVar19 != uVar15);
                  }
                }
                if ((options->ConditionNumber != NO) &&
                   (fVar27 = *rcond, fVar28 = smach("E"), fVar27 < fVar28)) {
                  *info = A->ncol + 1;
                }
                if (fVar5 != FACTORED) {
                  cQuerySpace(L,U,mem_usage);
                  Destroy_CompCol_Permuted(&AC);
                }
                if (A->Stype != SLU_NR) {
                  return;
                }
                Destroy_SuperMatrix_Store(local_e0);
                superlu_free(local_e0);
                return;
              }
            }
          }
        }
      }
      else {
        iVar14 = -6;
        if (*equed == 'N') {
          iVar16 = *info;
LAB_001033d6:
          if (iVar16 != 0) goto LAB_001032ac;
          goto LAB_001033de;
        }
      }
    }
  }
LAB_001032a6:
  *info = iVar14;
  iVar16 = iVar14;
LAB_001032ac:
  AC.Stype = -iVar16;
  input_error("cgssvx",(int *)&AC);
  return;
}

Assistant:

void
cgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, float *recip_pivot_growth, 
       float *rcond, float *ferr, float *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    singlecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern float clangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_C || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_C || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("cgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	cCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	cgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    claqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	cgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = cPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = cPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = clangs(norm, AA);
        cgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        cgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            cgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < slamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < smach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        cQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}